

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O3

ValuedAction
despot::POMCP::Evaluate
          (VNode *root,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,DSPOMDP *model,POMCPPrior *prior)

{
  pointer ppSVar1;
  bool bVar2;
  int iVar3;
  uint action;
  int iVar4;
  ACT_TYPE _action;
  pointer ppSVar5;
  undefined4 extraout_var;
  QNode *this;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *this_00;
  mapped_type *ppVVar6;
  _Base_ptr p_Var7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  _Rb_tree_header *p_Var11;
  _Base_ptr p_Var12;
  mapped_type vnode;
  undefined1 auVar13 [16];
  ValuedAction VVar14;
  OBS_TYPE obs;
  double reward;
  double local_90;
  double local_88;
  ulong local_78;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *local_70;
  VNode *local_68;
  double local_60;
  ulong local_58;
  State *local_50;
  double local_48;
  ValuedAction local_40;
  
  ppSVar5 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  local_90 = 0.0;
  lVar8 = (long)ppSVar1 - (long)ppSVar5;
  local_68 = root;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 3;
    lVar10 = 0;
    do {
      ppSVar5[lVar10]->scenario_id = (int)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar10);
    if (ppSVar1 != ppSVar5) {
      local_90 = 0.0;
      uVar9 = 0;
      local_70 = particles;
      do {
        local_50 = ppSVar5[uVar9];
        local_58 = uVar9;
        iVar3 = (*model->_vptr_DSPOMDP[0x16])(model);
        lVar8 = CONCAT44(extraout_var,iVar3);
        bVar2 = RandomStreams::Exhausted(streams);
        local_88 = 0.0;
        if (!bVar2) {
          local_88 = 0.0;
          iVar3 = 0;
          local_60 = 1.0;
          vnode = local_68;
          do {
            if (vnode == (VNode *)0x0) {
              action = POMCPPrior::GetAction(prior,local_50);
            }
            else {
              action = UpperBoundAction(vnode,0.0);
            }
            RandomStreams::Entry(streams,*(int *)(lVar8 + 0x10));
            iVar4 = (*model->_vptr_DSPOMDP[2])(model,lVar8,(ulong)action,&local_48,&local_78);
            local_88 = local_88 + local_48 * local_60;
            particles = local_70;
            if ((char)iVar4 != '\0') goto joined_r0x0016a53a;
            local_60 = local_60 * DAT_00192dc8;
            (*prior->_vptr_POMCPPrior[6])(prior,(ulong)action,local_78);
            RandomStreams::Advance(streams);
            if (vnode == (VNode *)0x0) {
LAB_0016a4bf:
              vnode = (mapped_type)0x0;
            }
            else {
              this = VNode::Child(vnode,action);
              this_00 = QNode::children(this);
              p_Var7 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
              if (p_Var7 == (_Base_ptr)0x0) goto LAB_0016a4bf;
              p_Var11 = &(this_00->_M_t)._M_impl.super__Rb_tree_header;
              p_Var12 = &p_Var11->_M_header;
              do {
                if (*(ulong *)(p_Var7 + 1) >= local_78) {
                  p_Var12 = p_Var7;
                }
                p_Var7 = (&p_Var7->_M_left)[*(ulong *)(p_Var7 + 1) < local_78];
              } while (p_Var7 != (_Base_ptr)0x0);
              if (((_Rb_tree_header *)p_Var12 == p_Var11) || (local_78 < *(ulong *)(p_Var12 + 1)))
              goto LAB_0016a4bf;
              ppVVar6 = std::
                        map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                        ::operator[](this_00,&local_78);
              vnode = *ppVVar6;
            }
            iVar3 = iVar3 + 1;
            bVar2 = RandomStreams::Exhausted(streams);
          } while (!bVar2);
          do {
            RandomStreams::Back(streams);
            (*prior->_vptr_POMCPPrior[7])(prior);
            iVar3 = iVar3 + -1;
            particles = local_70;
joined_r0x0016a53a:
            local_70 = particles;
          } while (iVar3 != 0);
        }
        local_90 = local_90 + local_88;
        (*model->_vptr_DSPOMDP[0x17])(model,lVar8);
        uVar9 = local_58 + 1;
        ppSVar5 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar9 < (ulong)((long)(particles->
                                     super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5 >>
                              3));
    }
  }
  _action = UpperBoundAction(local_68,0.0);
  lVar8 = (long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
  lVar10 = lVar8 >> 3;
  auVar13._8_4_ = (int)(lVar8 >> 0x23);
  auVar13._0_8_ = lVar10;
  auVar13._12_4_ = 0x45300000;
  ValuedAction::ValuedAction
            (&local_40,_action,
             local_90 /
             ((auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)));
  VVar14._4_4_ = 0;
  VVar14.action = local_40.action;
  VVar14.value = local_40.value;
  return VVar14;
}

Assistant:

ValuedAction POMCP::Evaluate(VNode* root, vector<State*>& particles,
	RandomStreams& streams, const DSPOMDP* model, POMCPPrior* prior) {
	double value = 0;

	for (int i = 0; i < particles.size(); i++)
		particles[i]->scenario_id = i;

	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		VNode* cur = root;
		State* copy = model->Copy(particle);
		double discount = 1.0;
		double val = 0;
		int steps = 0;

		// Simulate until all random numbers are consumed
		while (!streams.Exhausted()) {
			ACT_TYPE action =
				(cur != NULL) ?
					UpperBoundAction(cur, 0) : prior->GetAction(*particle);

			double reward;
			OBS_TYPE obs;
			bool terminal = model->Step(*copy, streams.Entry(copy->scenario_id),
				action, reward, obs);

			val += discount * reward;
			discount *= Globals::Discount();

			if (!terminal) {
				prior->Add(action, obs);
				streams.Advance();
				steps++;

				if (cur != NULL) {
					QNode* qnode = cur->Child(action);
					map<OBS_TYPE, VNode*>& vnodes = qnode->children();
					cur = vnodes.find(obs) != vnodes.end() ? vnodes[obs] : NULL;
				}
			} else {
				break;
			}
		}

		// Reset random streams and prior
		for (int i = 0; i < steps; i++) {
			streams.Back();
			prior->PopLast();
		}

		model->Free(copy);

		value += val;
	}

	return ValuedAction(UpperBoundAction(root, 0), value / particles.size());
}